

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O3

Ch __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::PercentDecodeStream::Take(PercentDecodeStream *this)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  bool bVar5;
  char cVar6;
  
  pcVar4 = this->src_;
  if ((*pcVar4 == '%') && (pcVar4 + 3 <= this->end_)) {
    this->src_ = pcVar4 + 1;
    pcVar4 = pcVar4 + 2;
    cVar3 = '\0';
    bVar5 = true;
    while( true ) {
      cVar1 = pcVar4[-1];
      cVar6 = -0x30;
      if (((9 < (byte)(cVar1 - 0x30U)) && (cVar6 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
         (cVar6 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) break;
      cVar3 = cVar3 * '\x10' + cVar1 + cVar6;
      this->src_ = pcVar4;
      pcVar4 = pcVar4 + 1;
      bVar2 = !bVar5;
      bVar5 = false;
      if (bVar2) {
        return cVar3;
      }
    }
  }
  this->valid_ = false;
  return '\0';
}

Assistant:

Ch Take() {
            if (*src_ != '%' || src_ + 3 > end_) { // %XY triplet
                valid_ = false;
                return 0;
            }
            src_++;
            Ch c = 0;
            for (int j = 0; j < 2; j++) {
                c = static_cast<Ch>(c << 4);
                Ch h = *src_;
                if      (h >= '0' && h <= '9') c = static_cast<Ch>(c + h - '0');
                else if (h >= 'A' && h <= 'F') c = static_cast<Ch>(c + h - 'A' + 10);
                else if (h >= 'a' && h <= 'f') c = static_cast<Ch>(c + h - 'a' + 10);
                else {
                    valid_ = false;
                    return 0;
                }
                src_++;
            }
            return c;
        }